

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv__close_nocheckstdio(int fd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  
  if (-1 < fd) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    lVar5 = syscall(3,fd);
    iVar3 = (int)lVar5;
    if (iVar3 == -1) {
      iVar2 = *piVar4;
      iVar3 = -iVar2;
      if (iVar2 == 0x73) {
        iVar3 = 0;
      }
      if (iVar2 == 4) {
        iVar3 = 0;
      }
      *piVar4 = iVar1;
    }
    return iVar3;
  }
  __assert_fail("fd > -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/core.c"
                ,0x24a,"int uv__close_nocheckstdio(int)");
}

Assistant:

int uv__close_nocheckstdio(int fd) {
  int saved_errno;
  int rc;

  assert(fd > -1);  /* Catch uninitialized io_watcher.fd bugs. */

  saved_errno = errno;
  rc = uv__close_nocancel(fd);
  if (rc == -1) {
    rc = UV__ERR(errno);
    if (rc == UV_EINTR || rc == UV__ERR(EINPROGRESS))
      rc = 0;    /* The close is in progress, not an error. */
    errno = saved_errno;
  }

  return rc;
}